

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall
args::
ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::ParseValue(ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,string *value_)

{
  std::__cxx11::string::_M_assign((string *)&this->value);
  return;
}

Assistant:

virtual void ParseValue(const std::string &value_) override
            {
#ifdef ARGS_NOEXCEPT
                if (!reader(name, value_, this->value))
                {
                    error = Error::Parse;
                }
#else
                reader(name, value_, this->value);
#endif
            }